

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

iterator * __thiscall Catch::clara::TextFlow::Columns::iterator::operator++(iterator *this)

{
  pointer pCVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  iterator local_60;
  
  lVar4 = 0;
  for (uVar3 = 0;
      pCVar1 = (this->m_columns->
               super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->m_columns->
                             super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x30);
      uVar3 = uVar3 + 1) {
    local_60.m_column =
         (Column *)
         ((long)&(pCVar1->m_strings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         + lVar4);
    local_60.m_stringIndex =
         *(long *)((long)&(pCVar1->m_strings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + lVar4 + 8) -
         *(long *)((long)&(pCVar1->m_strings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + lVar4) >> 5;
    local_60.m_end._0_1_ = 0;
    local_60._33_8_ = 0;
    local_60.m_pos = 0;
    local_60.m_len._0_1_ = 0;
    local_60.m_len._1_7_ = 0;
    bVar2 = Column::iterator::operator!=
                      ((iterator *)
                       ((long)&((this->m_iterators).
                                super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_column + lVar4),
                       &local_60);
    if (bVar2) {
      Column::iterator::operator++
                ((iterator *)
                 ((long)&((this->m_iterators).
                          super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_column + lVar4));
    }
    lVar4 = lVar4 + 0x30;
  }
  return this;
}

Assistant:

auto operator ++() -> iterator& {
			for (size_t i = 0; i < m_columns.size(); ++i) {
				if (m_iterators[i] != m_columns[i].end())
					++m_iterators[i];
			}
			return *this;
		}